

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetPropertyEquivalenceInfo
          (DictionaryTypeHandlerBase<unsigned_short> *this,PropertyRecord *propertyRecord,
          PropertyEquivalenceInfo *info)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  unsigned_short uVar4;
  undefined4 *puVar5;
  PropertyIndex PVar6;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord_local;
  DictionaryPropertyDescriptor<unsigned_short> *pDStack_28;
  int i;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  ushort uVar7;
  
  local_38 = propertyRecord;
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_38,&stack0xffffffffffffffd8,
                     (int *)((long)&propertyRecord_local + 4));
  if ((bVar3) && ((pDStack_28->Attributes & 8) == 0)) {
    uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDStack_28);
    if (uVar4 == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xeb,
                                  "(descriptor->template GetDataPropertyIndex<false>() != Constants::NoSlot)"
                                  ,"We don\'t support equivalent object type spec on accessors.");
      if (!bVar3) goto LAB_00da6aa9;
      *puVar5 = 0;
    }
    uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDStack_28);
    if (uVar4 == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xec,
                                  "(descriptor->template GetDataPropertyIndex<false>() <= Constants::PropertyIndexMax)"
                                  ,
                                  "We don\'t support equivalent object type spec on big property indexes."
                                 );
      if (!bVar3) {
LAB_00da6aa9:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDStack_28);
    if (uVar4 == 0xffff) {
      PVar6 = 0xffff;
    }
    else {
      uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
      uVar7 = -uVar1;
      if (uVar4 < uVar1) {
        uVar7 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
      }
      PVar6 = uVar7 + uVar4;
    }
    info->slotIndex = PVar6;
    info->isAuxSlot = (this->super_DynamicTypeHandler).inlineSlotCapacity <= uVar4;
    info->isWritable = (bool)(pDStack_28->Attributes >> 2 & 1);
  }
  else {
    info->slotIndex = 0xffff;
    info->isAuxSlot = false;
    info->isWritable = false;
  }
  return info->slotIndex != 0xffff;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            AssertMsg(descriptor->template GetDataPropertyIndex<false>() != Constants::NoSlot, "We don't support equivalent object type spec on accessors.");
            AssertMsg(descriptor->template GetDataPropertyIndex<false>() <= Constants::PropertyIndexMax, "We don't support equivalent object type spec on big property indexes.");
            T propertyIndex = descriptor->template GetDataPropertyIndex<false>();
            info.slotIndex = propertyIndex <= Constants::PropertyIndexMax ?
                AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(propertyIndex)) : Constants::NoSlot;
            info.isAuxSlot = propertyIndex >= GetInlineSlotCapacity();
            info.isWritable = !!(descriptor->Attributes & PropertyWritable);
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isAuxSlot = false;
            info.isWritable = false;
        }
        return info.slotIndex != Constants::NoSlot;
    }